

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::msgpack::
basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_uint64(basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
               *this,uint64_t val,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  char cVar1;
  byte bVar2;
  unsigned_short uVar3;
  undefined2 uVar4;
  uint uVar5;
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *pbVar6;
  char in_DL;
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_RSI;
  int64_t in_RDI;
  int64_t nanoseconds_1;
  int64_t seconds_1;
  ldiv_t dv_1;
  int64_t nanoseconds;
  int64_t seconds;
  ldiv_t dv;
  undefined7 in_stack_ffffffffffffff28;
  uint8_t in_stack_ffffffffffffff2f;
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff48;
  unsigned_short val_00;
  undefined6 in_stack_ffffffffffffff50;
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *val_01;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  bVar7;
  undefined7 in_stack_ffffffffffffff78;
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  
  val_00 = (unsigned_short)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  if (in_DL == '\x05') {
    write_timestamp(in_stack_ffffffffffffff80,CONCAT17(5,in_stack_ffffffffffffff78),in_RDI);
  }
  else if (in_DL == '\x06') {
    if (in_RSI == (basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                   *)0x0) {
      write_timestamp(in_stack_ffffffffffffff80,CONCAT17(6,in_stack_ffffffffffffff78),in_RDI);
    }
    else {
      std::div((int)in_RSI,1000);
      write_timestamp(in_stack_ffffffffffffff80,CONCAT17(in_DL,in_stack_ffffffffffffff78),in_RDI);
    }
  }
  else if (in_DL == '\a') {
    if (in_RSI == (basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                   *)0x0) {
      write_timestamp(in_stack_ffffffffffffff80,CONCAT17(7,in_stack_ffffffffffffff78),in_RDI);
    }
    else {
      std::div((int)in_RSI,1000000000);
      write_timestamp(in_stack_ffffffffffffff80,CONCAT17(in_DL,in_stack_ffffffffffffff78),in_RDI);
    }
  }
  else {
    cVar1 = std::numeric_limits<signed_char>::max();
    if ((basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
         *)(long)cVar1 < in_RSI) {
      bVar7.container =
           (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)in_RSI;
      bVar2 = std::numeric_limits<unsigned_char>::max();
      if ((basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
           *)(ulong)bVar2 < bVar7.container) {
        val_01 = in_RSI;
        uVar3 = std::numeric_limits<unsigned_short>::max();
        if ((basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
             *)(ulong)uVar3 < val_01) {
          pbVar6 = in_RSI;
          uVar5 = std::numeric_limits<unsigned_int>::max();
          if ((basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
               *)(ulong)uVar5 < pbVar6) {
            pbVar6 = (basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                      *)std::numeric_limits<unsigned_long>::max();
            if (in_RSI <= pbVar6) {
              bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::
              push_back((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
              std::
              back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
              binary::
              native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                        ((unsigned_long)val_01,bVar7);
              in_stack_ffffffffffffff30 = in_RSI;
            }
          }
          else {
            bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
                      ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
            uVar5 = (uint)((ulong)val_01 >> 0x20);
            std::
            back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                      ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
            binary::
            native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                      (uVar5,bVar7);
          }
        }
        else {
          bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
                    ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *
                     )in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
          uVar4 = SUB82(in_RSI,0);
          std::
          back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *
                     )CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
          bVar7.container._6_2_ = uVar4;
          bVar7.container._0_6_ = in_stack_ffffffffffffff50;
          binary::
          native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (val_00,bVar7);
        }
      }
      else {
        bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
                  ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
        bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
                  ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      }
    }
    else {
      bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
                ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
    }
  }
  end_value(in_stack_ffffffffffffff30);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t val, 
            semantic_tag tag, 
            const ser_context&,
            std::error_code&) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                    write_timestamp(static_cast<int64_t>(val), 0);
                    break;
                case semantic_tag::epoch_milli:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(static_cast<int64_t>(val), static_cast<int64_t>(millis_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem*nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(static_cast<int64_t>(val), static_cast<int64_t>(nanos_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    if (val <= static_cast<uint64_t>((std::numeric_limits<int8_t>::max)()))
                    {
                        // positive fixnum stores 7-bit positive integer
                        sink_.push_back(static_cast<uint8_t>(val));
                    }
                    else if (val <= (std::numeric_limits<uint8_t>::max)())
                    {
                        // uint 8 stores a 8-bit unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint8_type);
                        sink_.push_back(static_cast<uint8_t>(val));
                    }
                    else if (val <= (std::numeric_limits<uint16_t>::max)())
                    {
                        // uint 16 stores a 16-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint16_type);
                        binary::native_to_big(static_cast<uint16_t>(val),std::back_inserter(sink_));
                    }
                    else if (val <= (std::numeric_limits<uint32_t>::max)())
                    {
                        // uint 32 stores a 32-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint32_type);
                        binary::native_to_big(static_cast<uint32_t>(val),std::back_inserter(sink_));
                    }
                    else if (val <= (std::numeric_limits<uint64_t>::max)())
                    {
                        // uint 64 stores a 64-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint64_type);
                        binary::native_to_big(static_cast<uint64_t>(val),std::back_inserter(sink_));
                    }
                    break;
                }
            }
            end_value();
            JSONCONS_VISITOR_RETURN;
        }